

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yprp_node(lys_ypr_ctx_conflict *pctx,lysp_node *node)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  uint uVar3;
  long lVar4;
  void *exts;
  lysp_node_augment *aug;
  lysp_node_grp *plVar5;
  lysp_node_action *plVar6;
  ushort uVar7;
  uint uVar8;
  lysp_ext_instance *plVar9;
  ulong uVar10;
  lysp_ext_instance *plVar11;
  void *exts_00;
  int8_t flag_00;
  lysp_ext_instance *plVar12;
  char *pcVar13;
  lysp_ext_instance *in_R8;
  int8_t *flag_01;
  long lVar14;
  ulong uVar15;
  lysp_node_leaf *leaf;
  lysp_node *plVar16;
  lysp_node_augment **pplVar17;
  lysp_ext_instance **pplVar18;
  long lVar19;
  lysp_node_grp **pplVar20;
  lysp_node **pplVar21;
  lysp_node_action **pplVar22;
  int8_t flag_2;
  int8_t flag_1;
  int8_t flag;
  int8_t flag_3;
  int8_t local_41;
  int8_t local_40;
  int8_t local_3f;
  int8_t local_3e;
  int8_t local_3d;
  int8_t local_3c;
  int8_t local_3b;
  int8_t local_3a;
  int8_t local_39;
  lysp_ext_instance *local_38;
  
  uVar2 = node->nodetype;
  switch(uVar2) {
  case 1:
    local_40 = '\0';
    yprp_node_common1(pctx,node,&local_40);
    lVar14 = 0;
    plVar12 = (lysp_ext_instance *)0x0;
    while( true ) {
      if (node[1].parent == (lysp_node *)0x0) {
        plVar9 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar9 = node[1].parent[-1].exts;
      }
      if (plVar9 <= plVar12) break;
      ypr_close_parent(pctx,&local_40);
      yprp_restr(pctx,(lysp_restr *)((long)&(node[1].parent)->parent + lVar14),LY_STMT_MUST,
                 "condition",(int8_t *)in_R8);
      plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
      lVar14 = lVar14 + 0x40;
    }
    if (node[1].next != (lysp_node *)0x0) {
      ypr_close_parent(pctx,&local_40);
      ypr_substmt(pctx,LY_STMT_PRESENCE,'\0',(char *)node[1].next,node->exts);
    }
    yprp_node_common2(pctx,node,&local_40);
    lVar14 = 0;
    uVar15 = 0;
    while( true ) {
      if (node[1].name == (char *)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = *(ulong *)(node[1].name + -8);
      }
      if (uVar10 <= uVar15) break;
      ypr_close_parent(pctx,&local_40);
      yprp_typedef(pctx,(lysp_tpdf *)(node[1].name + lVar14));
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0xb0;
    }
    pplVar20 = (lysp_node_grp **)&node[1].dsc;
    while (plVar5 = *pplVar20, plVar5 != (lysp_node_grp *)0x0) {
      ypr_close_parent(pctx,&local_40);
      yprp_grouping(pctx,plVar5);
      pplVar20 = &(plVar5->field_0).field_1.next;
    }
    pplVar21 = (lysp_node **)&node[1].ref;
    while (plVar16 = *pplVar21, plVar16 != (lysp_node *)0x0) {
      ypr_close_parent(pctx,&local_40);
      yprp_node(pctx,plVar16);
      pplVar21 = &plVar16->next;
    }
    pplVar22 = (lysp_node_action **)&node[1].iffeatures;
    while (plVar6 = *pplVar22, plVar6 != (lysp_node_action *)0x0) {
      ypr_close_parent(pctx,&local_40);
      yprp_action(pctx,plVar6);
      pplVar22 = &(plVar6->field_0).field_1.next;
    }
    pplVar18 = &node[1].exts;
    while (plVar12 = *pplVar18, plVar12 != (lysp_ext_instance *)0x0) {
      ypr_close_parent(pctx,&local_40);
      yprp_notification(pctx,(lysp_node_notif *)plVar12);
      pplVar18 = (lysp_ext_instance **)&plVar12->format;
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar13 = "container";
    flag_00 = local_40;
    break;
  case 2:
    local_3f = '\0';
    yprp_node_common1(pctx,node,&local_3f);
    if (node[1].next != (lysp_node *)0x0) {
      ypr_close_parent(pctx,&local_3f);
      ypr_substmt(pctx,LY_STMT_DEFAULT,'\0',(char *)node[1].next,node->exts);
    }
    yprp_node_common2(pctx,node,&local_3f);
    for (plVar16 = node + 1; plVar16 = plVar16->parent, plVar16 != (lysp_node *)0x0;
        plVar16 = (lysp_node *)&plVar16->next) {
      ypr_close_parent(pctx,&local_3f);
      yprp_node(pctx,plVar16);
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar13 = "choice";
    flag_00 = local_3f;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0018b839_caseD_3;
  case 4:
    local_3c = '\x01';
    yprp_node_common1(pctx,node,&local_3c);
    yprp_type(pctx,(lysp_type *)&node[1].next);
    plVar12 = node->exts;
    lVar14 = 0;
    ypr_substmt(pctx,LY_STMT_UNITS,'\0',(char *)node[2].exts,plVar12);
    plVar9 = (lysp_ext_instance *)0x0;
    while( true ) {
      plVar16 = node[1].parent;
      if (plVar16 == (lysp_node *)0x0) {
        plVar11 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar11 = plVar16[-1].exts;
      }
      if (plVar11 <= plVar9) break;
      yprp_restr(pctx,(lysp_restr *)((long)&plVar16->parent + lVar14),LY_STMT_MUST,"condition",
                 (int8_t *)plVar12);
      plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
      lVar14 = lVar14 + 0x40;
    }
    ypr_substmt(pctx,LY_STMT_DEFAULT,'\0',(char *)node[3].parent,node->exts);
    yprp_node_common2(pctx,node,&local_3c);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar13 = "leaf";
    flag_00 = local_3c;
    break;
  case 8:
    local_3b = '\x01';
    yprp_node_common1(pctx,node,&local_3b);
    yprp_type(pctx,(lysp_type *)&node[1].next);
    plVar12 = node->exts;
    lVar14 = 0;
    ypr_substmt(pctx,LY_STMT_UNITS,'\0',(char *)node[2].exts,plVar12);
    plVar9 = (lysp_ext_instance *)0x0;
    while( true ) {
      plVar16 = node[1].parent;
      if (plVar16 == (lysp_node *)0x0) {
        plVar11 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar11 = plVar16[-1].exts;
      }
      if (plVar11 <= plVar9) break;
      yprp_restr(pctx,(lysp_restr *)((long)&plVar16->parent + lVar14),LY_STMT_MUST,"condition",
                 (int8_t *)plVar12);
      plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
      lVar14 = lVar14 + 0x40;
    }
    lVar14 = 0;
    plVar9 = (lysp_ext_instance *)0x0;
    while( true ) {
      plVar16 = node[3].parent;
      if (plVar16 == (lysp_node *)0x0) {
        plVar11 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar11 = plVar16[-1].exts;
      }
      if (plVar11 <= plVar9) break;
      plVar12 = node->exts;
      ypr_substmt(pctx,LY_STMT_DEFAULT,(uint8_t)plVar9,*(char **)((long)&plVar16->parent + lVar14),
                  plVar12);
      plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
      lVar14 = lVar14 + 0x18;
    }
    ypr_config(pctx,node->flags,node->exts,(int8_t *)0x0);
    uVar7 = node->flags;
    if ((uVar7 >> 9 & 1) != 0) {
      uVar3._0_2_ = node[3].nodetype;
      uVar3._2_2_ = node[3].flags;
      ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,(uint8_t)node->exts,(void *)(ulong)uVar3,
                   (unsigned_long)plVar12);
      uVar7 = node->flags;
    }
    if ((uVar7 >> 10 & 1) != 0) {
      plVar12 = node->exts;
      if ((void *)(ulong)*(uint *)&node[3].field_0xc == (void *)0x0) {
        ypr_substmt(pctx,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",plVar12);
      }
      else {
        ypr_unsigned(pctx,LY_STMT_MAX_ELEMENTS,(uint8_t)plVar12,
                     (void *)(ulong)*(uint *)&node[3].field_0xc,(unsigned_long)plVar12);
      }
    }
    uVar7 = node->flags;
    if ((uVar7 & 0xc0) != 0) {
      pcVar13 = "user";
      if ((uVar7 & 0x40) == 0) {
        pcVar13 = "system";
      }
      ypr_substmt(pctx,LY_STMT_ORDERED_BY,'\0',pcVar13,node->exts);
      uVar7 = node->flags;
    }
    ypr_status(pctx,uVar7,node->exts,&local_3b);
    ypr_description(pctx,node->dsc,node->exts,&local_3b);
    ypr_reference(pctx,node->ref,node->exts,&local_3b);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar13 = "leaf-list";
    flag_00 = local_3b;
    break;
  default:
    if (uVar2 == 0x10) {
      local_41 = '\0';
      yprp_node_common1(pctx,node,&local_41);
      lVar14 = 0;
      plVar12 = (lysp_ext_instance *)0x0;
      while( true ) {
        if (node[1].parent == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = node[1].parent[-1].exts;
        }
        if (plVar9 <= plVar12) break;
        ypr_close_parent(pctx,&local_41);
        yprp_restr(pctx,(lysp_restr *)((long)&(node[1].parent)->parent + lVar14),LY_STMT_MUST,
                   "condition",(int8_t *)in_R8);
        plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
        lVar14 = lVar14 + 0x40;
      }
      if (node[1].next != (lysp_node *)0x0) {
        ypr_close_parent(pctx,&local_41);
        in_R8 = node->exts;
        ypr_substmt(pctx,LY_STMT_KEY,'\0',(char *)node[1].next,in_R8);
      }
      lVar14 = 0;
      plVar12 = (lysp_ext_instance *)0x0;
      while( true ) {
        if (node[2].parent == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = node[2].parent[-1].exts;
        }
        if (plVar9 <= plVar12) break;
        ypr_close_parent(pctx,&local_41);
        in_R8 = node->exts;
        ypr_substmt(pctx,LY_STMT_UNIQUE,(uint8_t)plVar12,
                    *(char **)((long)&(node[2].parent)->parent + lVar14),in_R8);
        plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
        lVar14 = lVar14 + 0x18;
      }
      ypr_config(pctx,node->flags,node->exts,&local_41);
      uVar7 = node->flags;
      if ((uVar7 >> 9 & 1) != 0) {
        ypr_close_parent(pctx,&local_41);
        uVar8._0_2_ = node[2].nodetype;
        uVar8._2_2_ = node[2].flags;
        ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,(uint8_t)node->exts,(void *)(ulong)uVar8,
                     (unsigned_long)in_R8);
        uVar7 = node->flags;
      }
      if ((uVar7 >> 10 & 1) != 0) {
        ypr_close_parent(pctx,&local_41);
        plVar12 = node->exts;
        if ((void *)(ulong)*(uint *)&node[2].field_0xc == (void *)0x0) {
          ypr_substmt(pctx,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",plVar12);
        }
        else {
          ypr_unsigned(pctx,LY_STMT_MAX_ELEMENTS,(uint8_t)plVar12,
                       (void *)(ulong)*(uint *)&node[2].field_0xc,(unsigned_long)plVar12);
        }
      }
      uVar7 = node->flags;
      if ((uVar7 & 0xc0) != 0) {
        ypr_close_parent(pctx,&local_41);
        pcVar13 = "user";
        if ((node->flags & 0x40) == 0) {
          pcVar13 = "system";
        }
        ypr_substmt(pctx,LY_STMT_ORDERED_BY,'\0',pcVar13,node->exts);
        uVar7 = node->flags;
      }
      ypr_status(pctx,uVar7,node->exts,&local_41);
      ypr_description(pctx,node->dsc,node->exts,&local_41);
      ypr_reference(pctx,node->ref,node->exts,&local_41);
      lVar14 = 0;
      uVar15 = 0;
      while( true ) {
        if (node[1].name == (char *)0x0) {
          uVar10 = 0;
        }
        else {
          uVar10 = *(ulong *)(node[1].name + -8);
        }
        if (uVar10 <= uVar15) break;
        ypr_close_parent(pctx,&local_41);
        yprp_typedef(pctx,(lysp_tpdf *)(node[1].name + lVar14));
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 0xb0;
      }
      pplVar20 = (lysp_node_grp **)&node[1].dsc;
      while (plVar5 = *pplVar20, plVar5 != (lysp_node_grp *)0x0) {
        ypr_close_parent(pctx,&local_41);
        yprp_grouping(pctx,plVar5);
        pplVar20 = &(plVar5->field_0).field_1.next;
      }
      pplVar21 = (lysp_node **)&node[1].ref;
      while (plVar16 = *pplVar21, plVar16 != (lysp_node *)0x0) {
        ypr_close_parent(pctx,&local_41);
        yprp_node(pctx,plVar16);
        pplVar21 = &plVar16->next;
      }
      pplVar22 = (lysp_node_action **)&node[1].iffeatures;
      while (plVar6 = *pplVar22, plVar6 != (lysp_node_action *)0x0) {
        ypr_close_parent(pctx,&local_41);
        yprp_action(pctx,plVar6);
        pplVar22 = &(plVar6->field_0).field_1.next;
      }
      pplVar18 = &node[1].exts;
      while (plVar12 = *pplVar18, plVar12 != (lysp_ext_instance *)0x0) {
        ypr_close_parent(pctx,&local_41);
        yprp_notification(pctx,(lysp_node_notif *)plVar12);
        pplVar18 = (lysp_ext_instance **)&plVar12->format;
      }
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      pcVar13 = "list";
      flag_00 = local_41;
    }
    else if ((uVar2 == 0x20) || (uVar2 == 0x60)) {
      local_3a = '\0';
      yprp_node_common1(pctx,node,&local_3a);
      lVar14 = 0;
      plVar12 = (lysp_ext_instance *)0x0;
      while( true ) {
        if (node[1].parent == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = node[1].parent[-1].exts;
        }
        if (plVar9 <= plVar12) break;
        ypr_close_parent(pctx,&local_3a);
        yprp_restr(pctx,(lysp_restr *)((long)&(node[1].parent)->parent + lVar14),LY_STMT_MUST,
                   "condition",(int8_t *)in_R8);
        plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
        lVar14 = lVar14 + 0x40;
      }
      yprp_node_common2(pctx,node,&local_3a);
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      pcVar13 = lys_nodetype2str(node->nodetype);
      flag_00 = local_3a;
    }
    else if (uVar2 == 0x80) {
      local_39 = '\0';
      yprp_node_common1(pctx,node,&local_39);
      yprp_node_common2(pctx,node,&local_39);
      for (plVar16 = node + 1; plVar16 = plVar16->parent, plVar16 != (lysp_node *)0x0;
          plVar16 = (lysp_node *)&plVar16->next) {
        ypr_close_parent(pctx,&local_39);
        yprp_node(pctx,plVar16);
      }
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      pcVar13 = "case";
      flag_00 = local_39;
    }
    else {
      if (uVar2 != 0x800) {
        return;
      }
      local_3e = '\0';
      yprp_node_common1(pctx,node,&local_3e);
      yprp_node_common2(pctx,node,&local_3e);
      plVar12 = (lysp_ext_instance *)0x0;
      while( true ) {
        if (node[1].parent == (lysp_node *)0x0) {
          plVar9 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar9 = node[1].parent[-1].exts;
        }
        if (plVar9 <= plVar12) break;
        ypr_close_parent(pctx,&local_3e);
        plVar16 = node[1].parent;
        lVar14 = (long)plVar12 * 0x50;
        local_3d = '\0';
        local_38 = plVar12;
        ypr_open(pctx,"refine","target-node",*(char **)((long)plVar16 + lVar14),'\0');
        puVar1 = &(pctx->field_0).field_0.level;
        *puVar1 = *puVar1 + 1;
        flag_01 = &local_3d;
        yprp_extension_instances
                  (pctx,LY_STMT_REFINE,'\0',*(lysp_ext_instance **)((long)plVar16 + lVar14 + 0x40),
                   &local_3d);
        yprp_iffeatures(pctx,*(lysp_qname **)((long)plVar16 + lVar14 + 0x18),
                        *(lysp_ext_instance **)((long)plVar16 + lVar14 + 0x40),&local_3d);
        lVar19 = 0;
        uVar15 = 0;
        while( true ) {
          lVar4 = *(long *)((long)plVar16 + lVar14 + 0x20);
          if (lVar4 == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = *(ulong *)(lVar4 + -8);
          }
          if (uVar10 <= uVar15) break;
          ypr_close_parent(pctx,&local_3d);
          yprp_restr(pctx,(lysp_restr *)(*(long *)((long)plVar16 + lVar14 + 0x20) + lVar19),
                     LY_STMT_MUST,"condition",flag_01);
          uVar15 = uVar15 + 1;
          lVar19 = lVar19 + 0x40;
        }
        if (*(long *)((long)plVar16 + lVar14 + 0x28) != 0) {
          ypr_close_parent(pctx,&local_3d);
          flag_01 = *(int8_t **)((long)plVar16 + lVar14 + 0x40);
          ypr_substmt(pctx,LY_STMT_PRESENCE,'\0',*(char **)((long)plVar16 + lVar14 + 0x28),flag_01);
        }
        lVar19 = 0;
        uVar15 = 0;
        while( true ) {
          lVar4 = *(long *)((long)plVar16 + lVar14 + 0x30);
          if (lVar4 == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = *(ulong *)(lVar4 + -8);
          }
          if (uVar10 <= uVar15) break;
          ypr_close_parent(pctx,&local_3d);
          flag_01 = *(int8_t **)((long)plVar16 + lVar14 + 0x40);
          ypr_substmt(pctx,LY_STMT_DEFAULT,(uint8_t)uVar15,
                      *(char **)(*(long *)((long)plVar16 + lVar14 + 0x30) + lVar19),flag_01);
          uVar15 = uVar15 + 1;
          lVar19 = lVar19 + 0x18;
        }
        ypr_config(pctx,*(uint16_t *)((long)plVar16 + lVar14 + 0x48),
                   *(void **)((long)plVar16 + lVar14 + 0x40),&local_3d);
        ypr_mandatory(pctx,*(uint16_t *)((long)plVar16 + lVar14 + 0x48),
                      *(void **)((long)plVar16 + lVar14 + 0x40),&local_3d);
        uVar8 = *(uint *)((long)plVar16 + lVar14 + 0x48);
        if ((uVar8 >> 9 & 1) != 0) {
          ypr_close_parent(pctx,&local_3d);
          ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,
                       (uint8_t)*(undefined8 *)((long)plVar16 + lVar14 + 0x40),
                       (void *)(ulong)*(uint *)((long)plVar16 + lVar14 + 0x38),
                       (unsigned_long)flag_01);
          uVar8 = (uint)*(ushort *)((long)plVar16 + lVar14 + 0x48);
        }
        if ((uVar8 >> 10 & 1) != 0) {
          ypr_close_parent(pctx,&local_3d);
          exts_00 = (void *)(ulong)*(uint *)((long)plVar16 + lVar14 + 0x3c);
          exts = *(void **)((long)plVar16 + lVar14 + 0x40);
          if (exts_00 == (void *)0x0) {
            ypr_substmt(pctx,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",exts);
          }
          else {
            ypr_unsigned(pctx,LY_STMT_MAX_ELEMENTS,(uint8_t)exts,exts_00,(unsigned_long)exts);
          }
        }
        ypr_description(pctx,*(char **)((long)plVar16 + lVar14 + 8),
                        *(void **)((long)plVar16 + lVar14 + 0x40),&local_3d);
        ypr_reference(pctx,*(char **)((long)plVar16 + lVar14 + 0x10),
                      *(void **)((long)plVar16 + lVar14 + 0x40),&local_3d);
        puVar1 = &(pctx->field_0).field_0.level;
        *puVar1 = *puVar1 - 1;
        ypr_close(pctx,"refine",local_3d);
        plVar12 = (lysp_ext_instance *)((long)&local_38->name + 1);
      }
      pplVar17 = (lysp_node_augment **)&node[1].nodetype;
      while (aug = *pplVar17, aug != (lysp_node_augment *)0x0) {
        ypr_close_parent(pctx,&local_3e);
        yprp_augment(pctx,aug);
        pplVar17 = &(aug->field_0).field_1.next;
      }
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      pcVar13 = "uses";
      flag_00 = local_3e;
    }
  }
  ypr_close(pctx,pcVar13,flag_00);
switchD_0018b839_caseD_3:
  return;
}

Assistant:

static void
yprp_node(struct lys_ypr_ctx *pctx, const struct lysp_node *node)
{
    switch (node->nodetype) {
    case LYS_CONTAINER:
        yprp_container(pctx, node);
        break;
    case LYS_CHOICE:
        yprp_choice(pctx, node);
        break;
    case LYS_LEAF:
        yprp_leaf(pctx, node);
        break;
    case LYS_LEAFLIST:
        yprp_leaflist(pctx, node);
        break;
    case LYS_LIST:
        yprp_list(pctx, node);
        break;
    case LYS_USES:
        yprp_uses(pctx, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yprp_anydata(pctx, node);
        break;
    case LYS_CASE:
        yprp_case(pctx, node);
        break;
    default:
        break;
    }
}